

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

string * __thiscall
BmsParseInvalidBarChangeValueException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsParseInvalidBarChangeValueException *this)

{
  stringstream os;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,anon_var_dwarf_3a6c7,0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,(this->str_)._M_dataplus._M_p,(this->str_)._M_string_length);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsParseInvalidBarChangeValueException::Message( void ) const
{
  std::stringstream os;
  os << "小節長変更の値が不正です。不正な文字列 : " << str_;
  return os.str();
}